

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_attr_set_v3d(exr_context_t ctxt,int part_index,char *name,exr_attr_v3d_t *val)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  exr_result_t eVar3;
  int iVar4;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar3 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x15;
LAB_0011d086:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
    return eVar3;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 8;
    goto LAB_0011d086;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar3 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar3 == 0) {
    iVar4 = 0;
    if (local_30->type != EXR_ATTR_V3D) {
      pcVar7 = local_30->type_name;
      pcVar5 = "\'%s\' requested type \'v3d\', but stored attributes is type \'%s\'";
      uVar6 = 0x10;
      goto LAB_0011d150;
    }
  }
  else {
    if (eVar3 != 0xf) {
      return eVar3;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    iVar4 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V3D,0,(uint8_t **)0x0,&local_30);
  }
  if (val != (exr_attr_v3d_t *)0x0) {
    if (iVar4 != 0) {
      return iVar4;
    }
    peVar1 = (local_30->field_6).m33d;
    peVar1->m[2] = (val->field_0).field_0.z;
    dVar2 = (val->field_0).field_0.y;
    peVar1->m[0] = (val->field_0).field_0.x;
    peVar1->m[1] = dVar2;
    return 0;
  }
  pcVar5 = "No input value for setting \'%s\', type \'%s\'";
  pcVar7 = "v3d";
  uVar6 = 3;
LAB_0011d150:
  eVar3 = (**(code **)(ctxt + 0x48))(ctxt,uVar6,pcVar5,name,pcVar7);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_v3d (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v3d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V3D, v3d);
}